

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

void lyxml_correct_elem_ns(ly_ctx *ctx,lyxml_elem *elem,int copy_ns,int correct_attrs)

{
  lyxml_elem **pplVar1;
  lyxml_elem *plVar2;
  lyxml_elem *attr_parent;
  lyxml_ns *plVar3;
  lyxml_attr *plVar4;
  lyxml_elem *plVar5;
  
  plVar2 = elem;
  do {
    attr_parent = plVar2;
    plVar2 = attr_parent->parent;
  } while (plVar2 != (lyxml_elem *)0x0);
  plVar2 = elem;
  if (elem == (lyxml_elem *)0x0) {
    return;
  }
  do {
    plVar5 = plVar2;
    plVar4 = (lyxml_attr *)plVar5->ns;
    if (plVar4 != (lyxml_attr *)0x0) {
      if (copy_ns == 0) {
        plVar4 = (lyxml_attr *)0x0;
      }
      else {
        plVar3 = lyxml_get_ns(plVar5,plVar4->name);
        plVar5->ns = plVar3;
        if (plVar3 != (lyxml_ns *)0x0) goto LAB_0011fbb4;
        plVar4 = lyxml_dup_attr(ctx,plVar5,plVar4);
      }
      plVar5->ns = (lyxml_ns *)plVar4;
    }
LAB_0011fbb4:
    if (correct_attrs != 0) {
      for (plVar4 = plVar5->attr; plVar4 != (lyxml_attr *)0x0; plVar4 = plVar4->next) {
        lyxml_correct_attr_ns(ctx,plVar4,attr_parent,copy_ns);
      }
    }
    plVar2 = plVar5->child;
    if (plVar5->child == (lyxml_elem *)0x0) {
      if (plVar5 == elem) {
        return;
      }
      plVar2 = plVar5->next;
      if (plVar5->next == (lyxml_elem *)0x0) {
        plVar5 = plVar5->parent;
        do {
          if (plVar5->parent == elem->parent) {
            return;
          }
          pplVar1 = &plVar5->next;
          plVar2 = *pplVar1;
          plVar5 = plVar5->parent;
        } while (*pplVar1 == (lyxml_elem *)0x0);
      }
    }
  } while( true );
}

Assistant:

void
lyxml_correct_elem_ns(struct ly_ctx *ctx, struct lyxml_elem *elem, int copy_ns, int correct_attrs)
{
    const struct lyxml_ns *tmp_ns;
    struct lyxml_elem *elem_root, *ns_root, *tmp, *iter;
    struct lyxml_attr *attr;

    /* find the root of elem */
    for (elem_root = elem; elem_root->parent; elem_root = elem_root->parent);

    LY_TREE_DFS_BEGIN(elem, tmp, iter) {
        if (iter->ns) {
            /* find the root of elem NS */
            for (ns_root = iter->ns->parent; ns_root; ns_root = ns_root->parent);

            /* elem NS is defined outside elem subtree */
            if (ns_root != elem_root) {
                if (copy_ns) {
                    tmp_ns = iter->ns;
                    /* we may have already copied the NS over? */
                    iter->ns = lyxml_get_ns(iter, tmp_ns->prefix);

                    /* we haven't copied it over, copy it now */
                    if (!iter->ns) {
                        iter->ns = (struct lyxml_ns *)lyxml_dup_attr(ctx, iter, (struct lyxml_attr *)tmp_ns);
                    }
                } else {
                    iter->ns = NULL;
                }
            }
        }
        if (correct_attrs) {
            LY_TREE_FOR(iter->attr, attr) {
                lyxml_correct_attr_ns(ctx, attr, elem_root, copy_ns);
            }
        }
        LY_TREE_DFS_END(elem, tmp, iter);
    }
}